

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,StuntDouble *sd,SelectionSet *bs,int property,int comparator,
          float comparisonValue,int frame)

{
  SnapshotManager *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Atom *atom;
  Atom *atom_00;
  SelectionEvaluator *this_00;
  _func_int **pp_Var3;
  double dVar4;
  RealType RVar5;
  _Alloc_hider _Var6;
  Vector3d pos;
  Vector<double,_3U> local_78;
  _Alloc_hider local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  _Alloc_hider _Stack_40;
  
  this_00 = (SelectionEvaluator *)&stack0xffffffffffffffa0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)this_00);
  switch(property) {
  case 0x1c00:
    local_50 = sd->mass_;
    break;
  case 0x1c01:
    if (sd->objType_ < otRigidBody) {
      local_50 = getCharge(this_00,(Atom *)sd,frame);
    }
    else {
      local_50 = (pointer)0x0;
      if (sd->objType_ == otRigidBody) {
        pp_Var3 = (_func_int **)sd[2].mass_;
        _Var6._M_p = (pointer)0x0;
        if (pp_Var3 != sd[2].properties_._vptr_PropertyMap) goto LAB_001efb52;
        atom_00 = (Atom *)0x0;
        while (atom_00 != (Atom *)0x0) {
          local_48 = local_50;
          _Stack_40._M_p = _Var6._M_p;
          RVar5 = getCharge(this_00,atom_00,frame);
          local_50 = (double)local_48 + RVar5;
          pp_Var3 = pp_Var3 + 1;
          atom_00 = (Atom *)0x0;
          _Var6._M_p = _Stack_40._M_p;
          if (pp_Var3 != sd[2].properties_._vptr_PropertyMap) {
LAB_001efb52:
            atom_00 = (Atom *)*pp_Var3;
          }
        }
      }
    }
    break;
  case 0x1c02:
    StuntDouble::getPos((Vector3d *)&local_78,sd,frame);
    local_50 = local_78.data_[0];
    break;
  case 0x1c03:
    StuntDouble::getPos((Vector3d *)&local_78,sd,frame);
    local_50 = local_78.data_[1];
    break;
  case 0x1c04:
    StuntDouble::getPos((Vector3d *)&local_78,sd,frame);
    local_50 = local_78.data_[2];
    break;
  case 0x1c05:
    StuntDouble::getPos((Vector3d *)&local_78,sd,frame);
    local_50 = Vector<double,_3U>::length(&local_78);
    break;
  case 0x1c06:
    StuntDouble::getPos((Vector3d *)&local_78,sd,frame);
    Vector<double,_3U>::operator=((Vector<double,_3U> *)&stack0xffffffffffffffa0,&local_78);
    pSVar1 = this->info->sman_;
    iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)frame);
    Snapshot::wrapVector
              ((Snapshot *)CONCAT44(extraout_var_00,iVar2),(Vector3d *)&stack0xffffffffffffffa0);
    local_50 = local_60._M_p;
    break;
  case 0x1c07:
    StuntDouble::getPos((Vector3d *)&local_78,sd,frame);
    Vector<double,_3U>::operator=((Vector<double,_3U> *)&stack0xffffffffffffffa0,&local_78);
    pSVar1 = this->info->sman_;
    iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)frame);
    Snapshot::wrapVector
              ((Snapshot *)CONCAT44(extraout_var,iVar2),(Vector3d *)&stack0xffffffffffffffa0);
    local_50 = local_58;
    break;
  case 0x1c08:
    StuntDouble::getPos((Vector3d *)&local_78,sd,frame);
    Vector<double,_3U>::operator=((Vector<double,_3U> *)&stack0xffffffffffffffa0,&local_78);
    pSVar1 = this->info->sman_;
    iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)frame);
    Snapshot::wrapVector
              ((Snapshot *)CONCAT44(extraout_var_01,iVar2),(Vector3d *)&stack0xffffffffffffffa0);
    break;
  case 0x1c09:
    local_50 = (pointer)0x0;
    if (sd->objType_ < otRigidBody) {
      local_50 = (undefined8)sd->globalIndex_;
    }
    break;
  default:
    unrecognizedAtomProperty(this,property);
    local_50 = (pointer)0x0;
  }
  switch(comparator) {
  case 0x3400:
    if ((double)local_50 <= (double)comparisonValue) {
      return;
    }
    break;
  case 0x3401:
    if ((double)local_50 < (double)comparisonValue) {
      return;
    }
    break;
  case 0x3402:
    dVar4 = (double)comparisonValue;
    goto LAB_001efae4;
  case 0x3403:
    if ((double)comparisonValue <= (double)local_50) {
      return;
    }
    break;
  case 0x3404:
    local_50 = ABS((double)local_50 - (double)comparisonValue);
    dVar4 = 1e-06;
LAB_001efae4:
    if (dVar4 < (double)local_50) {
      return;
    }
    break;
  case 0x3405:
    if (((double)local_50 == (double)comparisonValue) &&
       (!NAN((double)local_50) && !NAN((double)comparisonValue))) {
      return;
    }
    break;
  default:
    goto switchD_001efab2_default;
  }
  OpenMDBitSet::setBitOn
            ((bs->bitsets_).
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start,(long)sd->globalIndex_);
switchD_001efab2_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(StuntDouble* sd, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue, int frame) {
    RealType propertyValue = 0.0;
    Vector3d pos;
    switch (property) {
    case Token::atomno:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = atom->getGlobalIndex();
      }
      break;
    case Token::mass:
      propertyValue = sd->getMass();
      break;
    case Token::charge:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = getCharge(atom, frame);
      } else if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        RigidBody::AtomIterator ai;
        Atom* atom;
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          propertyValue += getCharge(atom, frame);
        }
      }
      break;
    case Token::x:
      propertyValue = sd->getPos(frame).x();
      break;
    case Token::y:
      propertyValue = sd->getPos(frame).y();
      break;
    case Token::z:
      propertyValue = sd->getPos(frame).z();
      break;
    case Token::wrappedX:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.z();
      break;

    case Token::r:
      propertyValue = sd->getPos(frame).length();
      break;
    default:
      unrecognizedAtomProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }
    if (match) bs.bitsets_[STUNTDOUBLE].setBitOn(sd->getGlobalIndex());
  }